

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTPNStm * __thiscall CTcParser::parse_while(CTcParser *this,int *err)

{
  tc_toktyp_t tVar1;
  CTcPrsNode *pCVar2;
  CTPNStmEnclosing *stm;
  CTPNStm *body;
  int *in_RSI;
  CTcTokenizer *in_RDI;
  CTPNStmEnclosing *old_enclosing;
  CTPNStmWhile *while_stm;
  CTPNStm *body_stm;
  CTcPrsNode *expr;
  undefined8 in_stack_ffffffffffffffa8;
  int errnum;
  CTPNStmWhileBase *pCVar3;
  CTcTokenizer *in_stack_ffffffffffffffb8;
  CTPNStmWhile *in_stack_ffffffffffffffc0;
  undefined8 local_8;
  
  errnum = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  tVar1 = CTcTokenizer::next(in_stack_ffffffffffffffb8);
  if (tVar1 == TOKT_LPAR) {
    CTcTokenizer::next(in_stack_ffffffffffffffb8);
  }
  else {
    CTcTokenizer::log_error_curtok(in_RDI,errnum);
  }
  pCVar2 = parse_cond_expr((CTcParser *)in_RDI);
  if (pCVar2 == (CTcPrsNode *)0x0) {
    *in_RSI = 1;
    local_8 = (CTPNStmWhileBase *)0x0;
  }
  else {
    local_8 = (CTPNStmWhileBase *)CTcPrsAllocObj::operator_new(0x2bcbbb);
    CTPNStmWhile::CTPNStmWhile
              (in_stack_ffffffffffffffc0,(CTcPrsNode *)in_stack_ffffffffffffffb8,
               (CTPNStmEnclosing *)in_RDI);
    pCVar3 = local_8;
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2bcbf5);
    if (tVar1 == TOKT_RPAR) {
      CTcTokenizer::next(in_stack_ffffffffffffffb8);
    }
    else {
      CTcTokenizer::log_error_curtok(in_RDI,(int)((ulong)pCVar3 >> 0x20));
    }
    stm = set_enclosing_stm((CTcParser *)in_RDI,&local_8->super_CTPNStmEnclosing);
    body = parse_stm((CTcParser *)expr,(int *)body_stm,(CTPNStmSwitch *)while_stm,
                     old_enclosing._4_4_);
    set_enclosing_stm((CTcParser *)in_RDI,stm);
    if (*in_RSI == 0) {
      CTPNStmWhileBase::set_body(local_8,body);
    }
    else {
      local_8 = (CTPNStmWhileBase *)0x0;
    }
  }
  return (CTPNStm *)local_8;
}

Assistant:

CTPNStm *CTcParser::parse_while(int *err)
{
    CTcPrsNode *expr;
    CTPNStm *body_stm;
    CTPNStmWhile *while_stm;
    CTPNStmEnclosing *old_enclosing;
    
    /* skip the 'while' and check for the open paren */
    if (G_tok->next() == TOKT_LPAR)
    {
        /* skip the paren */
        G_tok->next();
    }
    else
    {
        /* 
         *   log an error, and proceed on the assumption that the paren
         *   was simply left out and the statement is otherwise
         *   well-formed 
         */
        G_tok->log_error_curtok(TCERR_REQ_WHILE_LPAR);
    }

    /* parse the condition expression */
    expr = parse_cond_expr();
    if (expr == 0)
    {
        *err = TRUE;
        return 0;
    }

    /* create the 'while' statement node */
    while_stm = new CTPNStmWhile(expr, enclosing_stm_);

    /* check for the close paren */
    if (G_tok->cur() == TOKT_RPAR)
    {
        /* skip the paren */
        G_tok->next();
    }
    else
    {
        /* log an error, and continue from here */
        G_tok->log_error_curtok(TCERR_REQ_WHILE_RPAR);
    }

    /* set the 'while' to enclose its body */
    old_enclosing = set_enclosing_stm(while_stm);

    /* parse the loop body */
    body_stm = parse_stm(err, 0, FALSE);

    /* restore the old enclosing statement */
    set_enclosing_stm(old_enclosing);

    /* give up on error */
    if (*err)
        return 0;

    /* set the body */
    while_stm->set_body(body_stm);

    /* that's it - build and return the 'while' node */
    return while_stm;
}